

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O0

bool __thiscall
google::protobuf::compiler::Parser::ConsumeNumber(Parser *this,double *output,char *error)

{
  bool bVar1;
  char *in_RDX;
  double *in_RSI;
  Parser *in_RDI;
  double dVar2;
  undefined1 auVar3 [16];
  string *unaff_retaddr;
  Tokenizer *in_stack_00000028;
  uint64 value;
  char *in_stack_ffffffffffffff58;
  Parser *in_stack_ffffffffffffff60;
  allocator *paVar4;
  string *in_stack_ffffffffffffff68;
  string *error_00;
  uint64 *in_stack_ffffffffffffff78;
  uint64 in_stack_ffffffffffffff80;
  string *in_stack_ffffffffffffff88;
  undefined1 local_49 [33];
  undefined8 local_28;
  char *local_20;
  double *local_18;
  bool local_1;
  
  local_20 = in_RDX;
  local_18 = in_RSI;
  bVar1 = LookingAtType(in_stack_ffffffffffffff60,
                        (TokenType)((ulong)in_stack_ffffffffffffff58 >> 0x20));
  if (bVar1) {
    io::Tokenizer::current(in_RDI->input_);
    dVar2 = io::Tokenizer::ParseFloat(unaff_retaddr);
    *local_18 = dVar2;
    io::Tokenizer::Next(in_stack_00000028);
    local_1 = true;
  }
  else {
    bVar1 = LookingAtType(in_stack_ffffffffffffff60,
                          (TokenType)((ulong)in_stack_ffffffffffffff58 >> 0x20));
    if (bVar1) {
      local_28 = 0;
      io::Tokenizer::current(in_RDI->input_);
      bVar1 = io::Tokenizer::ParseInteger
                        (in_stack_ffffffffffffff88,in_stack_ffffffffffffff80,
                         in_stack_ffffffffffffff78);
      if (!bVar1) {
        error_00 = (string *)local_49;
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)(local_49 + 1),"Integer out of range.",(allocator *)error_00);
        AddError(in_RDI,error_00);
        std::__cxx11::string::~string((string *)(local_49 + 1));
        std::allocator<char>::~allocator((allocator<char> *)local_49);
      }
      auVar3._8_4_ = (int)((ulong)local_28 >> 0x20);
      auVar3._0_8_ = local_28;
      auVar3._12_4_ = 0x45300000;
      *local_18 = (auVar3._8_8_ - 1.9342813113834067e+25) +
                  ((double)CONCAT44(0x43300000,(int)local_28) - 4503599627370496.0);
      io::Tokenizer::Next(in_stack_00000028);
      local_1 = true;
    }
    else {
      bVar1 = LookingAt(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
      if (bVar1) {
        dVar2 = std::numeric_limits<double>::infinity();
        *local_18 = dVar2;
        io::Tokenizer::Next(in_stack_00000028);
        local_1 = true;
      }
      else {
        bVar1 = LookingAt(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
        if (bVar1) {
          dVar2 = std::numeric_limits<double>::quiet_NaN();
          *local_18 = dVar2;
          io::Tokenizer::Next(in_stack_00000028);
          local_1 = true;
        }
        else {
          paVar4 = (allocator *)&stack0xffffffffffffff7f;
          std::allocator<char>::allocator();
          std::__cxx11::string::string((string *)&stack0xffffffffffffff80,local_20,paVar4);
          AddError(in_RDI,in_stack_ffffffffffffff68);
          std::__cxx11::string::~string((string *)&stack0xffffffffffffff80);
          std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff7f);
          local_1 = false;
        }
      }
    }
  }
  return local_1;
}

Assistant:

bool Parser::ConsumeNumber(double* output, const char* error) {
  if (LookingAtType(io::Tokenizer::TYPE_FLOAT)) {
    *output = io::Tokenizer::ParseFloat(input_->current().text);
    input_->Next();
    return true;
  } else if (LookingAtType(io::Tokenizer::TYPE_INTEGER)) {
    // Also accept integers.
    uint64 value = 0;
    if (!io::Tokenizer::ParseInteger(input_->current().text, kuint64max,
                                     &value)) {
      AddError("Integer out of range.");
      // We still return true because we did, in fact, parse a number.
    }
    *output = value;
    input_->Next();
    return true;
  } else if (LookingAt("inf")) {
    *output = std::numeric_limits<double>::infinity();
    input_->Next();
    return true;
  } else if (LookingAt("nan")) {
    *output = std::numeric_limits<double>::quiet_NaN();
    input_->Next();
    return true;
  } else {
    AddError(error);
    return false;
  }
}